

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

vm_obj_id_t __thiscall CTcGenTarg::gen_rexpat_obj(CTcGenTarg *this,char *txt,size_t len)

{
  uint id;
  CTcDataStream *this_00;
  size_t in_RCX;
  CTcDataStream *__n;
  char buf [5];
  vm_val_t val;
  char local_45 [5];
  vm_val_t local_40;
  
  this_00 = G_rexpat_stream;
  id = this->next_obj_;
  this->next_obj_ = id + 1;
  CTcParser::add_nonsym_obj(G_prs,id);
  CTcDataStream::write_obj_id(this_00,(ulong)id);
  local_40.typ = CONCAT22(local_40.typ._2_2_,5);
  CTcDataStream::write(this_00,(int)&local_40,(void *)0x2,in_RCX);
  __n = this_00;
  add_const_str(this,txt,len,this_00,this_00->ofs_ + 1);
  local_40.typ = VM_SSTRING;
  local_40.val.obj = 0;
  vmb_put_dh(local_45,&local_40);
  CTcDataStream::write(this_00,(int)local_45,(void *)0x5,(size_t)__n);
  return id;
}

Assistant:

vm_obj_id_t CTcGenTarg::gen_rexpat_obj(const char *txt, size_t len)
{
    /* write to RexPattern object stream */
    CTcDataStream *rs = G_rexpat_stream;

    /* generate a new object ID for the RexPattern object */
    vm_obj_id_t id = new_obj_id();

    /* add the object ID to the non-symbol object list */
    G_prs->add_nonsym_obj(id);

    /* 
     *   write the OBJS header - object ID plus byte count for metaclass data
     *   (a DATAHOLDER pointing to the constant string)
     */
    rs->write_obj_id(id);
    rs->write2(VMB_DATAHOLDER);

    /* 
     *   Add the source text as an ordinary constant string.  Generate its
     *   fixup in the RexPattern stream, in the DATAHOLDER we're about to
     *   write. 
     */
    add_const_str(txt, len, rs, rs->get_ofs() + 1);

    /* 
     *   Set up the constant string value.  Use zero as the pool offset,
     *   since the fixup for the constant string will fill this in when the
     *   pool layout is finalized. 
     */
    vm_val_t val;
    val.set_sstring(0);

    /* write the RexPattern data (a DATAHOLDER for the const string) */
    char buf[VMB_DATAHOLDER];
    vmb_put_dh(buf, &val);
    rs->write(buf, VMB_DATAHOLDER);

    /* return the new object ID */
    return id;
}